

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalArray<int>::SignalArray(SignalArray<int> *this,SignalBase<int> *sig)

{
  allocator<dynamicgraph::SignalBase<int>_*> local_1d;
  uint local_1c;
  SignalBase<int> *local_18;
  SignalBase<int> *sig_local;
  SignalArray<int> *this_local;
  
  local_1c = 0;
  local_18 = sig;
  sig_local = (SignalBase<int> *)this;
  SignalArray_const<int>::SignalArray_const(&this->super_SignalArray_const<int>,&local_1c);
  (this->super_SignalArray_const<int>)._vptr_SignalArray_const =
       (_func_int **)&PTR__SignalArray_0015cbe8;
  std::allocator<dynamicgraph::SignalBase<int>_*>::allocator(&local_1d);
  std::vector<dynamicgraph::SignalBase<int>_*,_std::allocator<dynamicgraph::SignalBase<int>_*>_>::
  vector(&this->array,0x14,&local_1d);
  std::allocator<dynamicgraph::SignalBase<int>_*>::~allocator(&local_1d);
  (this->super_SignalArray_const<int>).size = 0x14;
  addElmt(this,local_18);
  return;
}

Assistant:

SignalArray<Time>(SignalBase<Time> &sig)
      : SignalArray_const<Time>(0), array(DEFAULT_SIZE) {
    size = DEFAULT_SIZE;
    addElmt(&sig);
  }